

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::detectinterfaces(tetgenmesh *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int local_30;
  uint local_2c;
  int i;
  int internum;
  face shloop;
  shellface **subfacearray;
  tetgenmesh *this_local;
  
  face::face((face *)&i);
  if (this->b->quiet == 0) {
    printf("Detecting self-intersecting facets...\n");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->subfaces->items;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  shloop._8_8_ = operator_new__(uVar3);
  memorypool::traversalinit(this->subfaces);
  _i = shellfacetraverse(this,this->subfaces);
  local_30 = 0;
  while (_i != (shellface *)0x0) {
    *(shellface **)(shloop._8_8_ + (long)local_30 * 8) = _i;
    _i = shellfacetraverse(this,this->subfaces);
    local_30 = local_30 + 1;
  }
  local_2c = 0;
  interecursive(this,(shellface **)shloop._8_8_,(int)this->subfaces->items,0,this->xmin,this->xmax,
                this->ymin,this->ymax,this->zmin,this->zmax,(int *)&local_2c);
  if (this->b->quiet == 0) {
    if ((int)local_2c < 1) {
      printf("\nNo faces are intersecting.\n\n");
    }
    else {
      printf("\n!! Found %d pairs of faces are intersecting.\n\n",(ulong)local_2c);
    }
  }
  if ((int)local_2c < 1) {
    memorypool::restart(this->subfaces);
  }
  else {
    memorypool::traversalinit(this->subfaces);
    _i = shellfacetraverse(this,this->subfaces);
    while (_i != (shellface *)0x0) {
      bVar2 = sinfected(this,(face *)&i);
      if (bVar2) {
        suninfect(this,(face *)&i);
      }
      else {
        shellfacedealloc(this,this->subfaces,_i);
      }
      _i = shellfacetraverse(this,this->subfaces);
    }
  }
  return;
}

Assistant:

void tetgenmesh::detectinterfaces()
{
  shellface **subfacearray;
  face shloop;
  int internum;
  int i;

  if (!b->quiet) {
    printf("Detecting self-intersecting facets...\n");
  }

  // Construct a map from indices to subfaces;
  subfacearray = new shellface*[subfaces->items];
  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  i = 0;
  while (shloop.sh != (shellface *) NULL) {
    subfacearray[i] = shloop.sh;
    shloop.sh = shellfacetraverse(subfaces);
    i++;
  }

  internum = 0;
  // Recursively split the set of triangles into two sets using a cut plane
  //   parallel to x-, or, y-, or z-axis.  Stop splitting when the number
  //   of subfaces is not decreasing anymore. Do tests on the current set.
  interecursive(subfacearray, subfaces->items, 0, xmin, xmax, ymin, ymax,
                zmin, zmax, &internum);

  if (!b->quiet) {
    if (internum > 0) {
      printf("\n!! Found %d pairs of faces are intersecting.\n\n", internum);
    } else {
      printf("\nNo faces are intersecting.\n\n");
    }
  }

  if (internum > 0) {
    // Traverse all subfaces, deallocate those have not been infected (they
    //   are not intersecting faces). Uninfect those have been infected.
    //   After this loop, only intersecting faces remain.
    subfaces->traversalinit();
    shloop.sh = shellfacetraverse(subfaces);
    while (shloop.sh != (shellface *) NULL) {
      if (sinfected(shloop)) {
        suninfect(shloop);
      } else {
        shellfacedealloc(subfaces, shloop.sh);
      }
      shloop.sh = shellfacetraverse(subfaces);
    }
  } else {
    // Deallocate all subfaces.
    subfaces->restart();
  }
}